

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall glslang::TParseContext::parserError(TParseContext *this,char *s)

{
  TInputScanner *pTVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  uint uVar3;
  TSourceLoc *pTVar4;
  
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.currentScanner;
  if ((pTVar1->endOfFileReached == true) &&
     ((this->super_TParseContextBase).super_TParseVersions.numErrors != 0)) {
    if (pTVar1->singleLogical == false) {
      uVar3 = ~pTVar1->finale + pTVar1->numSources;
      if (pTVar1->currentSource <= (int)uVar3) {
        uVar3 = pTVar1->currentSource;
      }
      uVar2 = 0;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      pTVar4 = pTVar1->loc + uVar2;
    }
    else {
      pTVar4 = &pTVar1->logicalSourceLoc;
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)(this,pTVar4,"compilation terminated","","",UNRECOVERED_JUMPTABLE);
    return;
  }
  if (pTVar1->singleLogical == false) {
    uVar3 = ~pTVar1->finale + pTVar1->numSources;
    if (pTVar1->currentSource <= (int)uVar3) {
      uVar3 = pTVar1->currentSource;
    }
    uVar2 = 0;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    pTVar4 = pTVar1->loc + uVar2;
  }
  else {
    pTVar4 = &pTVar1->logicalSourceLoc;
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,pTVar4,"","",s,"");
  return;
}

Assistant:

void TParseContext::parserError(const char* s)
{
    if (! getScanner()->atEndOfInput() || numErrors == 0)
        error(getCurrentLoc(), "", "", s, "");
    else
        error(getCurrentLoc(), "compilation terminated", "", "");
}